

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O3

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,Mode value)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "Mode::Undefined";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "Mode::Write";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Mode::Read";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Mode::Append";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "ToString: Unknown Mode";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Mode::Sync";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Mode::Deferred";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(Mode value)
{
    switch (value)
    {
    case Mode::Undefined:
        return "Mode::Undefined";
    case Mode::Write:
        return "Mode::Write";
    case Mode::Read:
        return "Mode::Read";
    case Mode::Append:
        return "Mode::Append";
    case Mode::Sync:
        return "Mode::Sync";
    case Mode::Deferred:
        return "Mode::Deferred";
    default:
        return "ToString: Unknown Mode";
    }
}